

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

int AlphaComparator(AttVal *one,AttVal *two,ctmbstr *list)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = indexof(one->attribute,list);
  uVar2 = indexof(two->attribute,list);
  if ((int)(uVar1 | uVar2) < 0) {
    if ((int)uVar1 < 0 || uVar2 != 0xffffffff) {
      if (uVar1 != 0xffffffff || (int)uVar2 < 0) {
        iVar3 = prvTidytmbstrcmp(one->attribute,two->attribute);
        return iVar3;
      }
      uVar1 = 1;
    }
    else {
      uVar1 = 0xffffffff;
    }
  }
  else {
    uVar1 = -(uint)(uVar1 < uVar2) | 1;
  }
  return uVar1;
}

Assistant:

static
int AlphaComparator(AttVal *one, AttVal *two, ctmbstr *list)
{
    int oneIndex = indexof( one->attribute, list );
    int twoIndex = indexof( two->attribute, list );

    /* If both on the list, the lower index has priority. */
    if ( oneIndex >= 0 && twoIndex >= 0 )
        return oneIndex < twoIndex ? -1 : 1;

    /* If A on the list but B not on the list, then A has priority. */
    if ( oneIndex >= 0 && twoIndex == -1 )
        return -1;

    /* If A not on the list but B is on the list, then B has priority. */
    if ( oneIndex == -1 && twoIndex >= 0 )
        return 1;

    /* Otherwise nothing is on the list, so just compare strings. */
    return TY_(tmbstrcmp)(one->attribute, two->attribute);
}